

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::RenderStairs<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLin>
          (ImPlot *this,GetterFuncPtr *getter,TransformerLinLin *transformer,ImDrawList *DrawList,
          float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  float fVar5;
  ImPlotContext *pIVar6;
  ImDrawList *this_00;
  ImU32 col_00;
  int iVar7;
  double dVar8;
  double dVar9;
  undefined4 in_XMM1_Da;
  float fVar10;
  float fVar11;
  undefined4 in_XMM1_Db;
  float fVar12;
  ImVec2 p12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_70;
  ImDrawList *local_68;
  ImVec2 local_60;
  undefined1 local_58 [8];
  GetterFuncPtr *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar6 = GImPlot;
  col_00 = (ImU32)DrawList;
  local_68 = (ImDrawList *)transformer;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    iVar3 = *(int *)(this + 0x10);
    local_48 = iVar3 + -1;
    local_40 = line_weight * 0.5;
    local_58 = (undefined1  [8])this;
    local_50 = getter;
    local_44 = col_00;
    dVar9 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                      (long)(*(int *)(this + 0x14) % iVar3 + iVar3) % (long)iVar3 &
                                      0xffffffff);
    iVar3 = *(int *)&getter->Getter;
    IVar2 = GImPlot->PixelRange[iVar3].Min;
    local_3c.x = (float)(GImPlot->Mx * (dVar9 - (GImPlot->CurrentPlot->XAxis).Range.Min) +
                        (double)IVar2.x);
    local_3c.y = (float)(GImPlot->My[iVar3] *
                         ((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) -
                         GImPlot->CurrentPlot->YAxis[iVar3].Range.Min) + (double)IVar2.y);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLin>>
              ((StairsRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLinLin> *)local_58,local_68
               ,&pIVar6->CurrentPlot->PlotRect);
  }
  else {
    iVar3 = *(int *)(this + 0x10);
    dVar8 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                      (long)(*(int *)(this + 0x14) % iVar3 + iVar3) % (long)iVar3 &
                                      0xffffffff);
    this_00 = local_68;
    iVar3 = *(int *)&getter->Getter;
    IVar2 = GImPlot->PixelRange[iVar3].Min;
    dVar9 = (double)IVar2.x;
    local_58._0_4_ =
         (undefined4)(GImPlot->Mx * (dVar8 - (GImPlot->CurrentPlot->XAxis).Range.Min) + dVar9);
    local_58._4_4_ =
         (undefined4)
         (GImPlot->My[iVar3] *
          ((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) - GImPlot->CurrentPlot->YAxis[iVar3].Range.Min) +
         (double)IVar2.y);
    iVar3 = *(int *)(this + 0x10);
    if (1 < iVar3) {
      iVar7 = 1;
      do {
        dVar8 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                          (long)((*(int *)(this + 0x14) + iVar7) % iVar3 + iVar3) %
                                          (long)iVar3 & 0xffffffff);
        iVar3 = *(int *)&getter->Getter;
        IVar2 = GImPlot->PixelRange[iVar3].Min;
        fVar10 = (float)(GImPlot->Mx * (dVar8 - (GImPlot->CurrentPlot->XAxis).Range.Min) +
                        (double)IVar2.x);
        fVar12 = (float)(GImPlot->My[iVar3] * (dVar9 - GImPlot->CurrentPlot->YAxis[iVar3].Range.Min)
                        + (double)IVar2.y);
        local_60.y = fVar12;
        local_60.x = fVar10;
        pIVar4 = pIVar6->CurrentPlot;
        fVar5 = (float)local_58._4_4_;
        if (fVar12 <= (float)local_58._4_4_) {
          fVar5 = fVar12;
        }
        fVar11 = fVar12;
        if ((fVar5 < (pIVar4->PlotRect).Max.y) &&
           (fVar5 = (float)(~-(uint)(fVar12 <= (float)local_58._4_4_) & (uint)fVar12 |
                           -(uint)(fVar12 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar5 && fVar5 != *pfVar1)) {
          fVar12 = 0.0;
          fVar5 = (float)local_58._0_4_;
          if (fVar10 <= (float)local_58._0_4_) {
            fVar5 = fVar10;
          }
          fVar11 = (float)local_58._0_4_;
          if ((fVar5 < (pIVar4->PlotRect).Max.x) &&
             (fVar5 = (float)(-(uint)(fVar10 <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(fVar10 <= (float)local_58._0_4_) & (uint)fVar10),
             (pIVar4->PlotRect).Min.x <= fVar5 && fVar5 != (pIVar4->PlotRect).Min.x)) {
            local_70.y = (float)local_58._4_4_;
            local_70.x = fVar10;
            ImDrawList::AddLine(this_00,(ImVec2 *)local_58,&local_70,col_00,line_weight);
            ImDrawList::AddLine(this_00,&local_70,&local_60,col_00,line_weight);
          }
        }
        dVar9 = (double)CONCAT44(fVar12,fVar11);
        iVar7 = iVar7 + 1;
        iVar3 = *(int *)(this + 0x10);
        local_58 = (undefined1  [8])local_60;
      } while (iVar7 < iVar3);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}